

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_1b21075::PeerManagerImpl::TipMayBeStale(PeerManagerImpl *this)

{
  long lVar1;
  bool bVar2;
  strong_ordering sVar3;
  Params *this_00;
  duration<long,_std::ratio<1L,_1L>_> dVar4;
  duration<long,_std::ratio<1L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  Params *consensusParams;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  bool bVar5;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined8 in_stack_ffffffffffffffa0;
  memory_order __m;
  
  __m = (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
             in_stack_ffffffffffffff7c,(AnnotatedMixin<std::recursive_mutex> *)0x1088256);
  this_00 = CChainParams::GetConsensus
                      ((CChainParams *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                      );
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)this_00,__m);
  s<(char)48>();
  bVar2 = std::chrono::operator==
                    (in_RDI,(duration<long,_std::ratio<1L,_1L>_> *)
                            CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)))
  ;
  if (bVar2) {
    dVar4 = GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
    __m = (memory_order)((ulong)dVar4.__r >> 0x20);
    dVar4.__r._7_1_ = in_stack_ffffffffffffff97;
    dVar4.__r._0_7_ = in_stack_ffffffffffffff90;
    std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::operator=
              ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),dVar4);
  }
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)this_00,__m);
  GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(long *)0x1088311);
  std::chrono::operator-
            (in_RDI,(duration<long,_std::ratio<1L,_1L>_> *)
                    CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
  sVar3 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RDI);
  std::__cmp_cat::__unspec::__unspec
            ((__unspec *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (__unspec *)0x1088346);
  bVar2 = std::operator<(sVar3._M_value);
  bVar5 = false;
  if (bVar2) {
    bVar5 = std::
            multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
            ::empty((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool PeerManagerImpl::TipMayBeStale()
{
    AssertLockHeld(cs_main);
    const Consensus::Params& consensusParams = m_chainparams.GetConsensus();
    if (m_last_tip_update.load() == 0s) {
        m_last_tip_update = GetTime<std::chrono::seconds>();
    }
    return m_last_tip_update.load() < GetTime<std::chrono::seconds>() - std::chrono::seconds{consensusParams.nPowTargetSpacing * 3} && mapBlocksInFlight.empty();
}